

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
emplaceRealloc<slang::syntax::ExpressionSyntax_const*>
          (SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *this,pointer pos,
          ExpressionSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppEVar3;
  ExpressionSyntax **__result;
  ExpressionSyntax **ppEVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ExpressionSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::max_size
                    ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppEVar3 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::begin
                      ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
  __result = (ExpressionSyntax **)slang::detail::allocArray(capacity,8);
  ppEVar4 = __result + ((long)pos - (long)ppEVar3 >> 3);
  *ppEVar4 = *args;
  ppEVar3 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::end
                      ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
  if (pos == ppEVar3) {
    ppEVar3 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::begin
                        ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::end
                    ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::ExpressionSyntax_const**,slang::syntax::ExpressionSyntax_const**>
              (ppEVar3,(ExpressionSyntax **)ctx,__result);
  }
  else {
    ppEVar3 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::begin
                        ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::ExpressionSyntax_const**,slang::syntax::ExpressionSyntax_const**>
              (ppEVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::end
                    ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::ExpressionSyntax_const**,slang::syntax::ExpressionSyntax_const**>
              (pos,(ExpressionSyntax **)ctx,ppEVar4 + 1);
  }
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::cleanup
            ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(ExpressionSyntax ***)this = __result;
  return ppEVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}